

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void train(Ptr<cv::face::FacemarkLBF> *facemark)

{
  ulong uVar1;
  size_type sVar2;
  char *pcVar3;
  reference pvVar4;
  FacemarkLBF *pFVar5;
  _InputArray local_250;
  _InputArray local_238;
  _OutputArray local_220;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [32];
  Mat local_1c0;
  ulong local_160;
  size_t i;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> facial_points;
  Mat image;
  string local_c0 [32];
  undefined1 local_a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  landmarks_train;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  images_train;
  string local_68 [8];
  String ptsFiles;
  allocator local_31;
  string local_30 [8];
  String imageFiles;
  Ptr<cv::face::FacemarkLBF> *facemark_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"../dlib_faces_5points/images_train.txt",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,"../dlib_faces_5points/points_train.txt",
             (allocator *)
             ((long)&images_train.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&images_train.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&landmarks_train.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a0);
  std::__cxx11::string::string(local_c0,local_30);
  std::__cxx11::string::string((string *)(image.step.buf + 1),local_68);
  cv::face::loadDatasetList
            (local_c0,image.step.buf + 1,
             &landmarks_train.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_a0);
  std::__cxx11::string::~string((string *)(image.step.buf + 1));
  std::__cxx11::string::~string(local_c0);
  cv::Mat::Mat((Mat *)&facial_points.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&i);
  local_160 = 0;
  while( true ) {
    uVar1 = local_160;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&landmarks_train.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar2 <= uVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&landmarks_train.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,local_160);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e0,pcVar3,&local_1e1);
    cv::imread((string *)&local_1c0,(int)local_1e0);
    cv::Mat::operator=((Mat *)&facial_points.
                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1c0);
    cv::Mat::~Mat(&local_1c0);
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_a0,local_160);
    std::__cxx11::string::string(local_208,(string *)pvVar4);
    cv::_OutputArray::_OutputArray<cv::Point_<float>>
              (&local_220,(vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&i);
    cv::face::loadFacePoints(0,local_208,&local_220);
    cv::_OutputArray::~_OutputArray(&local_220);
    std::__cxx11::string::~string(local_208);
    pFVar5 = cv::Ptr<cv::face::FacemarkLBF>::operator->(facemark);
    cv::_InputArray::_InputArray
              (&local_238,
               (Mat *)&facial_points.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_InputArray::_InputArray<cv::Point_<float>>
              (&local_250,(vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&i);
    (**(code **)(*(long *)pFVar5 + 0x50))(pFVar5,&local_238,&local_250);
    cv::_InputArray::~_InputArray(&local_250);
    cv::_InputArray::~_InputArray(&local_238);
    local_160 = local_160 + 1;
  }
  pFVar5 = cv::Ptr<cv::face::FacemarkLBF>::operator->(facemark);
  (**(code **)(*(long *)pFVar5 + 0x58))(pFVar5,0);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&i);
  cv::Mat::~Mat((Mat *)&facial_points.
                        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&landmarks_train.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void train(Ptr<FacemarkLBF> facemark)
{
    // load the dataset list
    String imageFiles = "../dlib_faces_5points/images_train.txt";
    String ptsFiles = "../dlib_faces_5points/points_train.txt";
    vector<String> images_train;
    vector<String> landmarks_train;
    loadDatasetList(imageFiles,ptsFiles,images_train,landmarks_train);

    // add the training samples to the trainer
    Mat image;
    vector<Point2f> facial_points;
    for(size_t i=0;i<images_train.size();i++){
        image = imread(images_train[i].c_str());
        loadFacePoints(landmarks_train[i],facial_points);
        facemark->addTrainingSample(image, facial_points);
    }

    // training process
    facemark->training();
}